

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O1

void __thiscall
ValueHashTable<Sym_*,_Value_*>::Dump
          (ValueHashTable<Sym_*,_Value_*> *this,_func_void_Sym_ptr *valueDump)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  ulong uVar5;
  undefined1 local_40 [8];
  Iterator __iter;
  
  Output::Print(
               L"\n-------------------------------------------------------------------------------------------------\n"
               );
  if (this->tableSize != 0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar5 = 0;
    do {
      local_40 = (undefined1  [8])(this->table + uVar5);
      __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                    local_40;
      while( true ) {
        if (__iter.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
        __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                      ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_40) break;
        pTVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)local_40);
        (*valueDump)(pTVar4->value);
        Output::Print(L"  =>  ",pTVar4->value);
        ::Value::Dump(pTVar4->element);
        Output::Print(L"\n");
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->tableSize);
  }
  return;
}

Assistant:

void Dump(void (*valueDump)(TData))
    {
        Output::Print(_u("\n-------------------------------------------------------------------------------------------------\n"));
        FOREACH_VALUEHASHTABLE_ENTRY(HashBucket, bucket, this)
        {
            valueDump(bucket.value);
            Output::Print(_u("  =>  "), bucket.value);
            bucket.element->Dump();
            Output::Print(_u("\n"));
        }
        NEXT_VALUEHASHTABLE_ENTRY;
    }